

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O1

CString * allocator_default<CLocalizationDatabase::CString>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar2 = uVar3;
  }
  puVar4 = (ulong *)operator_new__(uVar2);
  *puVar4 = uVar5;
  if (size != 0) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar4 + lVar6 + 0x10) = 0;
      *(undefined4 *)((long)puVar4 + lVar6 + 0x18) = 0;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 * 0x18 != lVar6);
  }
  return (CString *)(puVar4 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }